

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

Opnd * __thiscall IR::Instr::UnlinkSrc2(Instr *this)

{
  Opnd *pOVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  
  pOVar1 = this->m_src2;
  bVar4 = pOVar1->field_0xb;
  if ((bVar4 & 2) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x2a,"(m_inUse)","Expected inUse to be set...");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    bVar4 = pOVar1->field_0xb;
  }
  pOVar1->field_0xb = bVar4 & 0xfd;
  this->m_src2 = (Opnd *)0x0;
  return pOVar1;
}

Assistant:

Opnd *
Instr::UnlinkSrc2()
{
    Opnd * oldSrc = this->m_src2;
    oldSrc->UnUse();
    this->m_src2 = nullptr;

    return oldSrc;
}